

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QPointer<QHttp2Stream> __thiscall
QHash<unsigned_int,_QPointer<QHttp2Stream>_>::value
          (QHash<unsigned_int,_QPointer<QHttp2Stream>_> *this,uint *key)

{
  Data *pDVar1;
  QPointer<QHttp2Stream> *pQVar2;
  uint *in_RDX;
  QObject *extraout_RDX;
  QPointer<QHttp2Stream> QVar3;
  
  pQVar2 = valueImpl<unsigned_int>((QHash<unsigned_int,_QPointer<QHttp2Stream>_> *)key,in_RDX);
  if (pQVar2 == (QPointer<QHttp2Stream> *)0x0) {
    this->d = (Data *)0x0;
    this[1].d = (Data *)0x0;
  }
  else {
    pDVar1 = (Data *)(pQVar2->wp).d;
    this->d = pDVar1;
    this[1].d = (Data *)(pQVar2->wp).value;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QVar3.wp.value = extraout_RDX;
  QVar3.wp.d = (Data *)this;
  return (QPointer<QHttp2Stream>)QVar3.wp;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }